

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_e1f08e::HandleLockCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view value;
  char *__s;
  bool bVar1;
  size_type sVar2;
  cmMakefile *pcVar3;
  const_reference pvVar4;
  string *in_base;
  cmGlobalGenerator *this;
  ulong uVar5;
  string local_298;
  undefined1 local_278 [8];
  string result;
  cmFileLockResult local_238;
  cmFileLockResult fileLockResult;
  cmFileLockPool *lockPool;
  FILE *local_208;
  FILE *file;
  Status local_1e0;
  undefined1 local_1d8 [8];
  string parentDir;
  string local_198;
  string local_178;
  unsigned_long local_158;
  long scanned;
  string local_148;
  allocator<char> local_121;
  string local_120;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  char *local_b8;
  char *merr;
  undefined1 local_a8 [4];
  uint i;
  string path;
  allocator<char> local_71;
  string local_70;
  unsigned_long local_50;
  unsigned_long timeout;
  string resultVariable;
  Guard guard;
  bool release;
  bool directory;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  resultVariable.field_2._M_local_buf[0xf] = '\0';
  resultVariable.field_2._M_local_buf[0xe] = '\0';
  resultVariable.field_2._8_4_ = 2;
  std::__cxx11::string::string((string *)&timeout);
  local_50 = 0xffffffffffffffff;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    pcVar3 = cmExecutionStatus::GetMakefile(status);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"sub-command LOCK requires at least two arguments.",&local_71);
    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    args_local._7_1_ = false;
    path.field_2._8_4_ = 1;
    goto LAB_0079d0a4;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,1);
  std::__cxx11::string::string((string *)local_a8,(string *)pvVar4);
  for (merr._4_4_ = 2; uVar5 = (ulong)merr._4_4_,
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar5 < sVar2; merr._4_4_ = merr._4_4_ + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)merr._4_4_);
    bVar1 = std::operator==(pvVar4,"DIRECTORY");
    if (bVar1) {
      resultVariable.field_2._M_local_buf[0xf] = '\x01';
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)merr._4_4_);
      bVar1 = std::operator==(pvVar4,"RELEASE");
      if (bVar1) {
        resultVariable.field_2._M_local_buf[0xe] = '\x01';
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)merr._4_4_);
        bVar1 = std::operator==(pvVar4,"GUARD");
        if (bVar1) {
          merr._4_4_ = merr._4_4_ + 1;
          local_b8 = "expected FUNCTION, FILE or PROCESS after GUARD";
          uVar5 = (ulong)merr._4_4_;
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (sVar2 <= uVar5) {
            pcVar3 = cmExecutionStatus::GetMakefile(status);
            __s = local_b8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_d9);
            cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_d8);
            std::__cxx11::string::~string((string *)&local_d8);
            std::allocator<char>::~allocator(&local_d9);
            args_local._7_1_ = false;
            path.field_2._8_4_ = 1;
            goto LAB_0079d088;
          }
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)merr._4_4_);
          bVar1 = std::operator==(pvVar4,"FUNCTION");
          if (bVar1) {
            resultVariable.field_2._8_4_ = 0;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)merr._4_4_);
            bVar1 = std::operator==(pvVar4,"FILE");
            if (bVar1) {
              resultVariable.field_2._8_4_ = 1;
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)merr._4_4_);
              bVar1 = std::operator==(pvVar4,"PROCESS");
              if (!bVar1) {
                pcVar3 = cmExecutionStatus::GetMakefile(status);
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)merr._4_4_);
                cmStrCat<char_const*&,char_const(&)[15],std::__cxx11::string_const&,char_const(&)[3]>
                          (&local_100,&local_b8,(char (*) [15])", but got:\n  \"",pvVar4,
                           (char (*) [3])0x123898a);
                cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_100);
                std::__cxx11::string::~string((string *)&local_100);
                args_local._7_1_ = false;
                path.field_2._8_4_ = 1;
                goto LAB_0079d088;
              }
              resultVariable.field_2._8_4_ = 2;
            }
          }
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)merr._4_4_);
          bVar1 = std::operator==(pvVar4,"RESULT_VARIABLE");
          if (bVar1) {
            merr._4_4_ = merr._4_4_ + 1;
            uVar5 = (ulong)merr._4_4_;
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if (sVar2 <= uVar5) {
              pcVar3 = cmExecutionStatus::GetMakefile(status);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_120,"expected variable name after RESULT_VARIABLE",
                         &local_121);
              cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_120);
              std::__cxx11::string::~string((string *)&local_120);
              std::allocator<char>::~allocator(&local_121);
              args_local._7_1_ = false;
              path.field_2._8_4_ = 1;
              goto LAB_0079d088;
            }
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)merr._4_4_);
            std::__cxx11::string::operator=((string *)&timeout,(string *)pvVar4);
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)merr._4_4_);
            bVar1 = std::operator==(pvVar4,"TIMEOUT");
            if (!bVar1) {
              pcVar3 = cmExecutionStatus::GetMakefile(status);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)merr._4_4_);
              cmStrCat<char_const(&)[56],char_const(&)[19],std::__cxx11::string_const&,char_const(&)[3]>
                        (&local_198,
                         (char (*) [56])"expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                         (char (*) [19])"TIMEOUT\nbut got: \"",pvVar4,(char (*) [3])0x123898a);
              cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_198);
              std::__cxx11::string::~string((string *)&local_198);
              args_local._7_1_ = false;
              path.field_2._8_4_ = 1;
              goto LAB_0079d088;
            }
            merr._4_4_ = merr._4_4_ + 1;
            uVar5 = (ulong)merr._4_4_;
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if (sVar2 <= uVar5) {
              pcVar3 = cmExecutionStatus::GetMakefile(status);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"expected timeout value after TIMEOUT",
                         (allocator<char> *)((long)&scanned + 7));
              cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_148);
              std::__cxx11::string::~string((string *)&local_148);
              std::allocator<char>::~allocator((allocator<char> *)((long)&scanned + 7));
              args_local._7_1_ = false;
              path.field_2._8_4_ = 1;
              goto LAB_0079d088;
            }
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)merr._4_4_);
            bVar1 = cmStrToLong(pvVar4,(long *)&local_158);
            if ((!bVar1) || ((long)local_158 < 0)) {
              pcVar3 = cmExecutionStatus::GetMakefile(status);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)merr._4_4_);
              cmStrCat<char_const(&)[16],std::__cxx11::string_const&,char_const(&)[30]>
                        (&local_178,(char (*) [16])"TIMEOUT value \"",pvVar4,
                         (char (*) [30])"\" is not an unsigned integer.");
              cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_178);
              std::__cxx11::string::~string((string *)&local_178);
              args_local._7_1_ = false;
              path.field_2._8_4_ = 1;
              goto LAB_0079d088;
            }
            local_50 = local_158;
          }
        }
      }
    }
  }
  if ((resultVariable.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)local_a8,"/cmake.lock");
  }
  pcVar3 = cmExecutionStatus::GetMakefile(status);
  in_base = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar3);
  cmsys::SystemTools::CollapseFullPath
            ((string *)((long)&parentDir.field_2 + 8),(string *)local_a8,in_base);
  std::__cxx11::string::operator=((string *)local_a8,(string *)(parentDir.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::~string((string *)(parentDir.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetParentDirectory((string *)local_1d8,(string *)local_a8);
  local_1e0 = cmsys::SystemTools::MakeDirectory((string *)local_1d8,(mode_t *)0x0);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_1e0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_208 = (FILE *)cmsys::SystemTools::Fopen((string *)local_a8,"w");
    if (local_208 == (FILE *)0x0) {
      pcVar3 = cmExecutionStatus::GetMakefile(status);
      cmStrCat<char_const(&)[9],std::__cxx11::string&,char_const(&)[39]>
                ((string *)&lockPool,(char (*) [9])0x125ad2f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 (char (*) [39])"\"\ncreation failed (check permissions).");
      cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)&lockPool);
      std::__cxx11::string::~string((string *)&lockPool);
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = false;
      path.field_2._8_4_ = 1;
    }
    else {
      fclose(local_208);
      pcVar3 = cmExecutionStatus::GetMakefile(status);
      this = cmMakefile::GetGlobalGenerator(pcVar3);
      fileLockResult = (cmFileLockResult)cmGlobalGenerator::GetFileLockPool(this);
      local_238 = cmFileLockResult::MakeOk();
      if ((resultVariable.field_2._M_local_buf[0xe] & 1U) == 0) {
        if (resultVariable.field_2._8_4_ == 0) {
          local_238 = cmFileLockPool::LockFunctionScope
                                ((cmFileLockPool *)fileLockResult,(string *)local_a8,local_50);
        }
        else if (resultVariable.field_2._8_4_ == 1) {
          local_238 = cmFileLockPool::LockFileScope
                                ((cmFileLockPool *)fileLockResult,(string *)local_a8,local_50);
        }
        else {
          if (resultVariable.field_2._8_4_ != 2) {
            cmSystemTools::SetFatalErrorOccurred();
            args_local._7_1_ = false;
            path.field_2._8_4_ = 1;
            goto LAB_0079d06c;
          }
          result.field_2._8_8_ =
               cmFileLockPool::LockProcessScope
                         ((cmFileLockPool *)fileLockResult,(string *)local_a8,local_50);
          local_238 = (cmFileLockResult)result.field_2._8_8_;
        }
      }
      else {
        local_238 = cmFileLockPool::Release((cmFileLockPool *)fileLockResult,(string *)local_a8);
      }
      cmFileLockResult::GetOutputMessage_abi_cxx11_((string *)local_278,&local_238);
      uVar5 = std::__cxx11::string::empty();
      if (((uVar5 & 1) == 0) || (bVar1 = cmFileLockResult::IsOk(&local_238), bVar1)) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          pcVar3 = cmExecutionStatus::GetMakefile(status);
          value = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_278);
          cmMakefile::AddDefinition(pcVar3,(string *)&timeout,value);
        }
        args_local._7_1_ = true;
      }
      else {
        pcVar3 = cmExecutionStatus::GetMakefile(status);
        cmStrCat<char_const(&)[23],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[2]>
                  (&local_298,(char (*) [23])"error locking file\n  \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   (char (*) [3])0x1279209,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   (char (*) [2])0x1237150);
        cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        cmSystemTools::SetFatalErrorOccurred();
        args_local._7_1_ = false;
      }
      path.field_2._8_4_ = 1;
      std::__cxx11::string::~string((string *)local_278);
    }
  }
  else {
    pcVar3 = cmExecutionStatus::GetMakefile(status);
    cmStrCat<char_const(&)[14],std::__cxx11::string&,char_const(&)[39]>
              ((string *)&file,(char (*) [14])"directory\n  \"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
               (char (*) [39])"\"\ncreation failed (check permissions).");
    cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = false;
    path.field_2._8_4_ = 1;
  }
LAB_0079d06c:
  std::__cxx11::string::~string((string *)local_1d8);
LAB_0079d088:
  std::__cxx11::string::~string((string *)local_a8);
LAB_0079d0a4:
  std::__cxx11::string::~string((string *)&timeout);
  return args_local._7_1_;
}

Assistant:

bool HandleLockCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard
  {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if (args.size() < 2) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      "sub-command LOCK requires at least two arguments.");
    return false;
  }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i) {
    if (args[i] == "DIRECTORY") {
      directory = true;
    } else if (args[i] == "RELEASE") {
      release = true;
    } else if (args[i] == "GUARD") {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(MessageType::FATAL_ERROR, merr);
        return false;
      }
      if (args[i] == "FUNCTION") {
        guard = GUARD_FUNCTION;
      } else if (args[i] == "FILE") {
        guard = GUARD_FILE;
      } else if (args[i] == "PROCESS") {
        guard = GUARD_PROCESS;
      } else {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat(merr, ", but got:\n  \"", args[i], "\"."));
        return false;
      }

    } else if (args[i] == "RESULT_VARIABLE") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          "expected variable name after RESULT_VARIABLE");
        return false;
      }
      resultVariable = args[i];
    } else if (args[i] == "TIMEOUT") {
      ++i;
      if (i >= args.size()) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR, "expected timeout value after TIMEOUT");
        return false;
      }
      long scanned;
      if (!cmStrToLong(args[i], &scanned) || scanned < 0) {
        status.GetMakefile().IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("TIMEOUT value \"", args[i],
                   "\" is not an unsigned integer."));
        return false;
      }
      timeout = static_cast<unsigned long>(scanned);
    } else {
      status.GetMakefile().IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or ",
                 "TIMEOUT\nbut got: \"", args[i], "\"."));
      return false;
    }
  }

  if (directory) {
    path += "/cmake.lock";
  }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(
    path, status.GetMakefile().GetCurrentSourceDirectory());

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir)) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("directory\n  \"", parentDir,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  FILE* file = cmsys::SystemTools::Fopen(path, "w");
  if (!file) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("file\n  \"", path,
               "\"\ncreation failed (check permissions)."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool =
    status.GetMakefile().GetGlobalGenerator()->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release) {
    fileLockResult = lockPool.Release(path);
  } else {
    switch (guard) {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccurred();
        return false;
    }
  }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk()) {
    status.GetMakefile().IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("error locking file\n  \"", path, "\"\n", result, "."));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!resultVariable.empty()) {
    status.GetMakefile().AddDefinition(resultVariable, result);
  }

  return true;
#else
  static_cast<void>(args);
  status.SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}